

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O0

int btbb_header_present(btbb_packet *pkt)

{
  byte bVar1;
  int c;
  int b;
  int a;
  char msb;
  int be;
  char *stream;
  btbb_packet *pkt_local;
  
  if (pkt->length < 0x7a) {
    pkt_local._4_4_ = 0;
  }
  else {
    bVar1 = pkt->symbols[0x3f];
    a = (int)(char)(pkt->symbols[0x43] ^ bVar1) +
        ((int)pkt->symbols[0x42] ^ (uint)((bVar1 != 0 ^ 0xffU) & 1)) +
        (int)(char)(pkt->symbols[0x41] ^ bVar1) +
        ((int)pkt->symbols[0x40] ^ (uint)((bVar1 != 0 ^ 0xffU) & 1));
    for (c = 0; c < 0x36; c = c + 3) {
      a = (char)(pkt->symbols[(long)c + 0x44] ^ pkt->symbols[(long)(c + 1) + 0x44] |
                 pkt->symbols[(long)(c + 1) + 0x44] ^ pkt->symbols[(long)(c + 2) + 0x44] |
                pkt->symbols[(long)(c + 2) + 0x44] ^ pkt->symbols[(long)c + 0x44]) + a;
    }
    pkt_local._4_4_ = (uint)(a < 5);
  }
  return pkt_local._4_4_;
}

Assistant:

int btbb_header_present(const btbb_packet* pkt)
{
	/* skip to last bit of sync word */
	const char *stream = pkt->symbols + 63;
	int be = 0; /* bit errors */
	char msb;   /* most significant (last) bit of sync word */
	int a, b, c;

	/* check that we have enough symbols */
	if (pkt->length < 122)
		return 0;

	/* check that the AC trailer is correct */
	msb = stream[0];
	be += stream[1] ^ !msb;
	be += stream[2] ^ msb;
	be += stream[3] ^ !msb;
	be += stream[4] ^ msb;

	/*
	 * Each bit of the 18 bit header is repeated three times.  Without
	 * checking the correctness of any particular bit, just count the
	 * number of times three symbols in a row don't all agree.
	 */
	stream += 5;
	for (a = 0; a < 54; a += 3) {
		b = a + 1;
		c = a + 2;
		be += ((stream[a] ^ stream[b]) |
			(stream[b] ^ stream[c]) | (stream[c] ^ stream[a]));
	}

	/*
	 * Few bit errors indicates presence of a header.  Many bit errors
	 * indicates no header is present (i.e. it is an ID packet).
	 */
	return (be < ID_THRESHOLD);
}